

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.h
# Opt level: O2

int __thiscall
TPZDohrMatrix<double,_TPZDohrSubstruct<double>_>::ClassId
          (TPZDohrMatrix<double,_TPZDohrSubstruct<double>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_bb1;
  string local_bb0;
  TPZDohrSubstruct<double> local_b90;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bb0,"TPZDohrMatrix",&local_bb1);
  uVar1 = Hash(&local_bb0);
  iVar2 = TPZMatrix<double>::ClassId(&this->super_TPZMatrix<double>);
  TPZDohrSubstruct<double>::TPZDohrSubstruct(&local_b90);
  iVar3 = TPZDohrSubstruct<double>::ClassId(&local_b90);
  TPZDohrSubstruct<double>::~TPZDohrSubstruct(&local_b90);
  std::__cxx11::string::~string((string *)&local_bb0);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrMatrix<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrMatrix") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}